

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c-writer.cc
# Opt level: O3

string_view __thiscall
wabt::anon_unknown_0::StripLeadingDollar(anon_unknown_0 *this,string_view name)

{
  string_view sVar1;
  
  if (this == (anon_unknown_0 *)0x0) {
    __assert_fail("!name.empty()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/src/c-writer.cc"
                  ,0x2fb,
                  "std::string_view wabt::(anonymous namespace)::StripLeadingDollar(std::string_view)"
                 );
  }
  if (*(char *)name._M_len == '$') {
    sVar1._M_str = (char *)name._M_len + 1;
    sVar1._M_len = (size_t)(this + -1);
    return sVar1;
  }
  __assert_fail("name.front() == \'$\'",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/src/c-writer.cc"
                ,0x2fc,
                "std::string_view wabt::(anonymous namespace)::StripLeadingDollar(std::string_view)"
               );
}

Assistant:

std::string_view StripLeadingDollar(std::string_view name) {
  assert(!name.empty());
  assert(name.front() == '$');
  name.remove_prefix(1);
  return name;
}